

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O2

void __thiscall
boost::runtime::parameter<unsigned_int,_(boost::runtime::args_amount)0,_false>::produce_argument
          (parameter<unsigned_int,_(boost::runtime::args_amount)0,_false> *this,cstring *token,
          bool param_2,arguments_store *store)

{
  cstring local_28;
  cstring local_10;
  
  local_28.m_begin = token->m_begin;
  local_28.m_end = token->m_end;
  local_10.m_begin = (this->super_basic_param).p_name._M_dataplus._M_p;
  local_10.m_end = local_10.m_begin + (this->super_basic_param).p_name._M_string_length;
  argument_factory<unsigned_int,_false,_false>::produce_argument
            (&this->m_arg_factory,&local_28,&local_10,store);
  return;
}

Assistant:

virtual void    produce_argument( cstring token, bool , arguments_store& store ) const
    {
        m_arg_factory.produce_argument( token, this->p_name, store );
    }